

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O1

void __thiscall deqp::egl::SimpleConfigCase::deinit(SimpleConfigCase *this)

{
  pointer ppvVar1;
  Library *pLVar2;
  
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar2->_vptr_Library[0x34])(pLVar2,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  ppvVar1 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar1) {
    (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar1;
  }
  return;
}

Assistant:

void SimpleConfigCase::deinit (void)
{
	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
	m_configs.clear();
}